

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem = pvVar1;
  *(void **)(&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
              super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x21];
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x22];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = vtt[0x23];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = vtt[0x24];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.field_0x90 = vtt[0x25];
  *(void **)&(this->super_IfcTerminatorSymbol).field_0xa8 = vtt[0x26];
  std::__cxx11::string::~string((string *)&(this->super_IfcTerminatorSymbol).field_0xb8);
  IfcStyledItem::~IfcStyledItem((IfcStyledItem *)this,vtt + 4);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}